

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * copyString(XML_Char *s,XML_Memory_Handling_Suite *memsuite)

{
  XML_Char *result;
  size_t charsRequired;
  XML_Memory_Handling_Suite *memsuite_local;
  XML_Char *s_local;
  
  for (result = (XML_Char *)0x0; s[(long)result] != '\0'; result = result + 1) {
  }
  s_local = (XML_Char *)(*memsuite->malloc_fcn)((size_t)(result + 1));
  if (s_local == (XML_Char *)0x0) {
    s_local = (XML_Char *)0x0;
  }
  else {
    memcpy(s_local,s,(size_t)(result + 1));
  }
  return s_local;
}

Assistant:

static XML_Char *
copyString(const XML_Char *s, const XML_Memory_Handling_Suite *memsuite) {
  size_t charsRequired = 0;
  XML_Char *result;

  /* First determine how long the string is */
  while (s[charsRequired] != 0) {
    charsRequired++;
  }
  /* Include the terminator */
  charsRequired++;

  /* Now allocate space for the copy */
  result = memsuite->malloc_fcn(charsRequired * sizeof(XML_Char));
  if (result == NULL)
    return NULL;
  /* Copy the original into place */
  memcpy(result, s, charsRequired * sizeof(XML_Char));
  return result;
}